

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O0

void __thiscall CEAngle::SetAngle(CEAngle *this,double *angle,CEAngleType *angle_type)

{
  undefined8 uVar1;
  int *in_RDX;
  double *in_RSI;
  long in_RDI;
  allocator local_71;
  string local_70 [48];
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  invalid_value *in_stack_ffffffffffffffd0;
  
  if (*in_RDX == 0) {
    *(double *)(in_RDI + 8) = *in_RSI * 0.017453292519943295;
  }
  else {
    if (*in_RDX != 1) {
      uVar1 = __cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc8,
                 "CEAngle::SetAngle(const double&, const CEAngleType&)",
                 (allocator *)&stack0xffffffffffffffc7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,"[ERROR] Method cannot be called with the provided CEAngleType",&local_71)
      ;
      CEException::invalid_value::invalid_value
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      __cxa_throw(uVar1,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    *(double *)(in_RDI + 8) = *in_RSI;
  }
  return;
}

Assistant:

void CEAngle::SetAngle(const double&      angle,
                       const CEAngleType& angle_type)
{
    // Set from degree angle
    if (angle_type == CEAngleType::DEGREES) {
        angle_ = angle * DD2R;
    }
    // Set from radians angle
    else if (angle_type == CEAngleType::RADIANS) {
        angle_ = angle;
    }
    // Otherwise throw an exception
    else {
        throw CEException::invalid_value(
            "CEAngle::SetAngle(const double&, const CEAngleType&)",
            "[ERROR] Method cannot be called with the provided CEAngleType");
    }

    return;
}